

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

void mi_thread_init(void)

{
  mi_arena_id_t arena_id;
  long lVar1;
  void *adst;
  mi_heap_t *heap;
  void *adst_1;
  mi_threadid_t *in_FS_OFFSET;
  anon_union_16_2_8cef793c_for_mem local_30;
  undefined2 local_20;
  char cStack_1e;
  undefined5 uStack_1d;
  
  mi_process_init();
  if ((mi_heap_t *)in_FS_OFFSET[-5] != (mi_heap_t *)0x0 &&
      (mi_heap_t *)in_FS_OFFSET[-5] != &_mi_heap_empty) {
    return;
  }
  if ((_mi_heap_main.thread_id == 0) || (_mi_heap_main.thread_id == *in_FS_OFFSET)) {
    mi_heap_main_init();
    heap = &_mi_heap_main;
    in_FS_OFFSET[-5] = (mi_threadid_t)&_mi_heap_main;
  }
  else {
    lVar1 = 0;
    do {
      if (*(long *)((long)td_cache + lVar1) != 0) {
        LOCK();
        heap = *(mi_heap_t **)((long)td_cache + lVar1);
        *(long *)((long)td_cache + lVar1) = 0;
        UNLOCK();
        if (heap != (mi_heap_t *)0x0) goto LAB_0049c5d8;
      }
      lVar1 = lVar1 + 8;
    } while (lVar1 != 0x100);
    heap = (mi_heap_t *)_mi_os_alloc(0x2030,(mi_memid_t *)&local_30.os);
    if ((heap == (mi_heap_t *)0x0) &&
       (heap = (mi_heap_t *)_mi_os_alloc(0x2030,(mi_memid_t *)&local_30.os),
       heap == (mi_heap_t *)0x0)) {
      heap = (mi_heap_t *)0x0;
      _mi_error_message(0xc,"unable to allocate thread local heap metadata (%zu bytes)\n",0x2030);
LAB_0049c5d8:
      cStack_1e = '\0';
    }
    else {
      heap[2].pages[0x21].first = (mi_page_t *)CONCAT53(uStack_1d,CONCAT12(cStack_1e,local_20));
      heap[2].pages[0x20].last = (mi_page_t *)local_30.os.base;
      heap[2].pages[0x20].block_size = local_30.os.size;
    }
    if ((heap == (mi_heap_t *)0x0) || (cStack_1e != '\0')) {
      if (heap == (mi_heap_t *)0x0) goto LAB_0049c665;
    }
    else {
      memset(heap,0,0xc08);
    }
    memcpy((mi_tld_t *)(heap + 1),&tld_empty,0x1410);
    heap[1].thread_id = (mi_threadid_t)heap;
    *(undefined8 *)&heap[1].arena_id = 0;
    heap[1].pages_free_direct[0x56] = (mi_page_t *)&mi_subproc_default;
    heap[1].pages_free_direct[0x57] = (mi_page_t *)(heap[1].pages_free_direct + 0x58);
    arena_id = _mi_arena_id_none();
    _mi_heap_init(heap,(mi_tld_t *)(heap + 1),arena_id,false,'\0');
    in_FS_OFFSET[-5] = (mi_threadid_t)heap;
  }
  _mi_prim_thread_associate_default_heap(heap);
LAB_0049c665:
  _mi_stat_increase(&_mi_stats_main.threads,1);
  LOCK();
  thread_count = thread_count + 1;
  UNLOCK();
  return;
}

Assistant:

void mi_thread_init(void) mi_attr_noexcept
{
  // ensure our process has started already
  mi_process_init();

  // initialize the thread local default heap
  // (this will call `_mi_heap_set_default_direct` and thus set the
  //  fiber/pthread key to a non-zero value, ensuring `_mi_thread_done` is called)
  if (_mi_thread_heap_init()) return;  // returns true if already initialized

  _mi_stat_increase(&_mi_stats_main.threads, 1);
  mi_atomic_increment_relaxed(&thread_count);
  //_mi_verbose_message("thread init: 0x%zx\n", _mi_thread_id());
}